

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HApp.cpp
# Opt level: O2

int solveMulti(char *filename,char *partitionfile)

{
  int iVar1;
  HModel model;
  char acStack_15c68 [4416];
  HDual solver;
  
  HModel::HModel(&model);
  _model = 1;
  if (partitionfile != (char *)0x0) {
    std::__cxx11::string::assign(acStack_15c68);
  }
  iVar1 = HModel::load_fromMPS((char *)&model);
  if (iVar1 == 0) {
    HModel::scaleModel();
    HDual::HDual(&solver);
    HDual::solve((HModel *)&solver,(int)&model,2);
    HModel::util_reportSolverOutcome((char *)&model);
    HModel::writePivots((char *)&model);
    HDual::~HDual(&solver);
  }
  HModel::~HModel(&model);
  return iVar1;
}

Assistant:

int solveMulti(const char *filename, const char *partitionfile) {
    HModel model;
    model.intOption[INTOPT_PRINT_FLAG] = 1;
    model.intOption[INTOPT_PERMUTE_FLAG] = 1;
    if (partitionfile) {
        model.strOption[STROPT_PARTITION_FILE] = partitionfile;
    }
    int RtCd = model.load_fromMPS(filename);
    if (RtCd) return RtCd;

    model.scaleModel();
    HDual solver;
    solver.solve(&model, HDUAL_VARIANT_MULTI, 8);

    model.util_reportSolverOutcome("Solve multi");
#ifdef JAJH_dev
    model.writePivots("multi");
#endif
    return 0;
}